

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::CatalogSetSecretStorage::GetSecretByName
          (CatalogSetSecretStorage *this,string *name,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  CatalogTransaction transaction_00;
  pointer this_00;
  CatalogEntry *pCVar1;
  type args;
  optional_ptr<duckdb::CatalogTransaction,_true> in_RCX;
  optional_ptr<duckdb::CatalogEntry,_true> res;
  optional_ptr<duckdb::CatalogEntry,_true> local_60;
  CatalogTransaction local_58;
  
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                        *)((long)&name[1].field_2 + 8));
  GetTransactionOrDefault(&local_58,(CatalogSetSecretStorage *)name,in_RCX);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  local_60 = CatalogSet::GetEntry(this_00,transaction_00,(string *)transaction.ptr);
  if (local_60.ptr == (CatalogEntry *)0x0) {
    (this->super_SecretStorage)._vptr_SecretStorage = (_func_int **)0x0;
  }
  else {
    pCVar1 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&local_60);
    args = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
           operator*((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>
                      *)&pCVar1[1].oid);
    make_uniq<duckdb::SecretEntry,duckdb::SecretEntry&>((duckdb *)this,args);
  }
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
}

Assistant:

unique_ptr<SecretEntry> CatalogSetSecretStorage::GetSecretByName(const string &name,
                                                                 optional_ptr<CatalogTransaction> transaction) {
	auto res = secrets->GetEntry(GetTransactionOrDefault(transaction), name);

	if (res) {
		auto &cast_entry = res->Cast<SecretCatalogEntry>();
		return make_uniq<SecretEntry>(*cast_entry.secret);
	}

	return nullptr;
}